

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

void Abc_NodeComplement(Abc_Obj_t *pNode)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NtkIsLogic(pNode->pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsNetlist(pNode->pNtk), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNode->pNtk) || Abc_NtkIsNetlist(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x3f5,"void Abc_NodeComplement(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x3f6,"void Abc_NodeComplement(Abc_Obj_t *)");
  }
  iVar1 = Abc_NtkHasSop(pNode->pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasAig(pNode->pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasBdd(pNode->pNtk);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                      ,0x400,"void Abc_NodeComplement(Abc_Obj_t *)");
      }
      (pNode->field_5).pData = (void *)((ulong)(pNode->field_5).pData ^ 1);
    }
    else {
      pHVar2 = Hop_Not((Hop_Obj_t *)(pNode->field_5).pData);
      (pNode->field_5).pData = pHVar2;
    }
  }
  else {
    Abc_SopComplement((char *)(pNode->field_5).pData);
  }
  return;
}

Assistant:

void Abc_NodeComplement( Abc_Obj_t * pNode )
{
    assert( Abc_NtkIsLogic(pNode->pNtk) || Abc_NtkIsNetlist(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_NtkHasSop(pNode->pNtk) )
        Abc_SopComplement( (char *)pNode->pData );
    else if ( Abc_NtkHasAig(pNode->pNtk) )
        pNode->pData = Hop_Not( (Hop_Obj_t *)pNode->pData );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNode->pNtk) )
        pNode->pData = Cudd_Not( pNode->pData );
#endif
    else
        assert( 0 );
}